

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O3

void __thiscall QMimeData::setUrls(QMimeData *this,QList<QUrl> *urls)

{
  QMimeDataPrivate *this_00;
  const_iterator i1;
  long in_FS_OFFSET;
  QArrayDataPointer<QVariant> QStack_78;
  QString local_60;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMimeDataPrivate *)(this->super_QObject).d_ptr.d;
  local_60.d.d = (Data *)0x0;
  local_60.d.ptr = L"text/uri-list";
  local_60.d.size = 0xd;
  i1.i = (urls->d).ptr;
  QList<QVariant>::QList<QList<QUrl>::const_iterator,_true>
            ((QList<QVariant> *)&QStack_78,i1,i1.i + (urls->d).size);
  ::QVariant::QVariant(&local_48,(QList<QVariant> *)&QStack_78);
  QMimeDataPrivate::setData(this_00,&local_60,&local_48);
  ::QVariant::~QVariant(&local_48);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&QStack_78);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeData::setUrls(const QList<QUrl> &urls)
{
    Q_D(QMimeData);
    d->setData(textUriListLiteral(), QList<QVariant>(urls.cbegin(), urls.cend()));
}